

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_skip_next_stream(void *a)

{
  trico_stream_type tVar1;
  trico_stream_type st;
  trico_archive *arch;
  void *a_local;
  
  tVar1 = trico_get_next_stream_type(a);
  switch(tVar1) {
  case trico_empty:
    a_local._4_4_ = 1;
    break;
  case trico_vertex_float_stream:
    a_local._4_4_ = trico_read_vertices(a,(float **)0x0);
    break;
  case trico_vertex_double_stream:
    a_local._4_4_ = trico_read_vertices_double(a,(double **)0x0);
    break;
  case trico_triangle_uint32_stream:
    a_local._4_4_ = trico_read_triangles(a,(uint32_t **)0x0);
    break;
  case trico_triangle_uint64_stream:
    a_local._4_4_ = trico_read_triangles_long(a,(uint64_t **)0x0);
    break;
  case trico_uv_per_vertex_float_stream:
    a_local._4_4_ = trico_read_uv_per_vertex(a,(float **)0x0);
    break;
  case trico_uv_per_vertex_double_stream:
    a_local._4_4_ = trico_read_uv_per_vertex_double(a,(double **)0x0);
    break;
  case trico_uv_per_triangle_float_stream:
    a_local._4_4_ = trico_read_uv_per_triangle(a,(float **)0x0);
    break;
  case trico_uv_per_triangle_double_stream:
    a_local._4_4_ = trico_read_uv_per_triangle_double(a,(double **)0x0);
    break;
  case trico_vertex_normal_float_stream:
    a_local._4_4_ = trico_read_vertex_normals(a,(float **)0x0);
    break;
  case trico_vertex_normal_double_stream:
    a_local._4_4_ = trico_read_vertex_normals_double(a,(double **)0x0);
    break;
  case trico_triangle_normal_float_stream:
    a_local._4_4_ = trico_read_triangle_normals(a,(float **)0x0);
    break;
  case trico_triangle_normal_double_stream:
    a_local._4_4_ = trico_read_triangle_normals_double(a,(double **)0x0);
    break;
  case trico_vertex_color_stream:
    a_local._4_4_ = trico_read_vertex_colors(a,(uint32_t **)0x0);
    break;
  case trico_triangle_color_stream:
    a_local._4_4_ = trico_read_triangle_colors(a,(uint32_t **)0x0);
    break;
  case trico_attribute_float_stream:
    a_local._4_4_ = trico_read_attributes_float(a,(float **)0x0);
    break;
  case trico_attribute_double_stream:
    a_local._4_4_ = trico_read_attributes_double(a,(double **)0x0);
    break;
  case trico_attribute_uint8_stream:
    a_local._4_4_ = trico_read_attributes_uint8(a,(uint8_t **)0x0);
    break;
  case trico_attribute_uint16_stream:
    a_local._4_4_ = trico_read_attributes_uint16(a,(uint16_t **)0x0);
    break;
  case trico_attribute_uint32_stream:
    a_local._4_4_ = trico_read_attributes_uint32(a,(uint32_t **)0x0);
    break;
  case trico_attribute_uint64_stream:
    a_local._4_4_ = trico_read_attributes_uint64(a,(uint64_t **)0x0);
    break;
  default:
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int trico_skip_next_stream(void* a)
    {
    struct trico_archive* arch = (struct trico_archive*)a;
    enum trico_stream_type st = trico_get_next_stream_type(arch);
    switch (st)
      {
      case trico_empty: return 1;
      case trico_vertex_float_stream: return trico_read_vertices(arch, NULL);
      case trico_vertex_double_stream: return trico_read_vertices_double(arch, NULL);
      case trico_triangle_uint32_stream: return trico_read_triangles(arch, NULL);
      case trico_triangle_uint64_stream: return trico_read_triangles_long(arch, NULL);
      case trico_uv_per_vertex_float_stream: return trico_read_uv_per_vertex(arch, NULL);
      case trico_uv_per_vertex_double_stream: return trico_read_uv_per_vertex_double(arch, NULL);
      case trico_uv_per_triangle_float_stream: return trico_read_uv_per_triangle(arch, NULL);
      case trico_uv_per_triangle_double_stream: return trico_read_uv_per_triangle_double(arch, NULL);
      case trico_vertex_normal_float_stream: return trico_read_vertex_normals(arch, NULL);
      case trico_vertex_normal_double_stream: return trico_read_vertex_normals_double(arch, NULL);
      case trico_triangle_normal_float_stream: return trico_read_triangle_normals(arch, NULL);
      case trico_vertex_color_stream: return trico_read_vertex_colors(arch, NULL);
      case trico_triangle_color_stream: return trico_read_triangle_colors(arch, NULL);
      case trico_triangle_normal_double_stream: return trico_read_triangle_normals_double(arch, NULL);
      case trico_attribute_float_stream: return trico_read_attributes_float(arch, NULL);
      case trico_attribute_double_stream: return trico_read_attributes_double(arch, NULL);
      case trico_attribute_uint8_stream: return trico_read_attributes_uint8(arch, NULL);
      case trico_attribute_uint16_stream: return trico_read_attributes_uint16(arch, NULL);
      case trico_attribute_uint32_stream: return trico_read_attributes_uint32(arch, NULL);
      case trico_attribute_uint64_stream: return trico_read_attributes_uint64(arch, NULL);
      }
    return 0;
    }